

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashUpdateInternal
              (xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,void *payload,
              xmlHashDeallocator dealloc,int update)

{
  xmlHashEntry *pxVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  xmlHashEntry *local_a0;
  xmlHashEntry *cur;
  xmlHashEntry *end;
  uint pos;
  uint displ;
  uint mask;
  uint newSize;
  int found;
  uint hashValue;
  size_t lengths [3];
  xmlHashEntry *entry;
  xmlChar *copy3;
  xmlChar *copy2;
  xmlChar *copy;
  xmlHashDeallocator dealloc_local;
  void *payload_local;
  xmlChar *key3_local;
  xmlChar *key2_local;
  xmlChar *key_local;
  xmlHashTablePtr hash_local;
  
  lengths[2] = 0;
  memset(&found,0,0x18);
  mask = 0;
  if ((hash == (xmlHashTablePtr)0x0) || (key == (xmlChar *)0x0)) {
    hash_local._4_4_ = -1;
  }
  else {
    newSize = xmlHashValue(hash->randomSeed,key,key2,key3,(size_t *)&found);
    if (hash->size != 0) {
      lengths[2] = (size_t)xmlHashFindEntry(hash,key,key2,key3,newSize,(int *)&mask);
    }
    if (mask == 0) {
      if ((hash->size >> 3) * 7 < hash->nbElems + 1) {
        if (hash->size == 0) {
          displ = 8;
        }
        else {
          if (0x7fffffff < hash->size) {
            return -1;
          }
          displ = hash->size << 1;
        }
        iVar2 = xmlHashGrow(hash,displ);
        if (iVar2 != 0) {
          return -1;
        }
        uVar3 = hash->size - 1;
        end._4_4_ = 0;
        end._0_4_ = newSize & uVar3;
        lengths[2] = (size_t)(hash->table + (uint)end);
        if (((xmlHashEntry *)lengths[2])->hashValue != 0) {
          do {
            end._4_4_ = end._4_4_ + 1;
            end._0_4_ = (uint)end + 1;
            lengths[2] = lengths[2] + 0x28;
            if (((uint)end & uVar3) == 0) {
              lengths[2] = (size_t)hash->table;
            }
            bVar4 = false;
            if (*(int *)lengths[2] != 0) {
              bVar4 = end._4_4_ <= ((uint)end - *(int *)lengths[2] & uVar3);
            }
          } while (bVar4);
        }
      }
      if (hash->dict == (xmlDictPtr)0x0) {
        copy2 = (xmlChar *)(*xmlMalloc)(_found + 1);
        if (copy2 == (xmlChar *)0x0) {
          return -1;
        }
        memcpy(copy2,key,_found + 1);
        if (key2 == (xmlChar *)0x0) {
          copy3 = (xmlChar *)0x0;
        }
        else {
          copy3 = (xmlChar *)(*xmlMalloc)(lengths[0] + 1);
          if (copy3 == (xmlChar *)0x0) {
            (*xmlFree)(copy2);
            return -1;
          }
          memcpy(copy3,key2,lengths[0] + 1);
        }
        if (key3 == (xmlChar *)0x0) {
          entry = (xmlHashEntry *)0x0;
        }
        else {
          entry = (xmlHashEntry *)(*xmlMalloc)(lengths[1] + 1);
          if (entry == (xmlHashEntry *)0x0) {
            (*xmlFree)(copy2);
            (*xmlFree)(copy3);
            return -1;
          }
          memcpy(entry,key3,lengths[1] + 1);
        }
      }
      else {
        iVar2 = xmlDictOwns(hash->dict,key);
        copy2 = key;
        if ((iVar2 == 0) && (copy2 = xmlDictLookup(hash->dict,key,-1), copy2 == (xmlChar *)0x0)) {
          return -1;
        }
        copy3 = key2;
        if (((key2 != (xmlChar *)0x0) && (iVar2 = xmlDictOwns(hash->dict,key2), iVar2 == 0)) &&
           (copy3 = xmlDictLookup(hash->dict,key2,-1), copy3 == (xmlChar *)0x0)) {
          return -1;
        }
        entry = (xmlHashEntry *)key3;
        if (((key3 != (xmlChar *)0x0) && (iVar2 = xmlDictOwns(hash->dict,key3), iVar2 == 0)) &&
           (entry = (xmlHashEntry *)xmlDictLookup(hash->dict,key3,-1), entry == (xmlHashEntry *)0x0)
           ) {
          return -1;
        }
      }
      if (*(int *)lengths[2] != 0) {
        pxVar1 = hash->table;
        uVar3 = hash->size;
        local_a0 = (xmlHashEntry *)lengths[2];
        do {
          local_a0 = local_a0 + 1;
          if (pxVar1 + uVar3 <= local_a0) {
            local_a0 = hash->table;
          }
        } while (local_a0->hashValue != 0);
        if (local_a0 < lengths[2]) {
          memmove(hash->table + 1,hash->table,(long)local_a0 - (long)hash->table);
          local_a0 = pxVar1 + uVar3 + -1;
          memcpy(hash->table,local_a0,0x28);
        }
        memmove((void *)(lengths[2] + 0x28),(void *)lengths[2],(long)local_a0 - lengths[2]);
      }
      *(xmlChar **)(lengths[2] + 8) = copy2;
      *(xmlChar **)(lengths[2] + 0x10) = copy3;
      *(xmlHashEntry **)(lengths[2] + 0x18) = entry;
      *(void **)(lengths[2] + 0x20) = payload;
      *(uint *)lengths[2] = newSize | 0x80000000;
      hash->nbElems = hash->nbElems + 1;
      hash_local._4_4_ = 1;
    }
    else {
      if (update != 0) {
        if (dealloc != (xmlHashDeallocator)0x0) {
          (*dealloc)(*(void **)(lengths[2] + 0x20),*(xmlChar **)(lengths[2] + 8));
        }
        *(void **)(lengths[2] + 0x20) = payload;
      }
      hash_local._4_4_ = 0;
    }
  }
  return hash_local._4_4_;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static int
xmlHashUpdateInternal(xmlHashTablePtr hash, const xmlChar *key,
                      const xmlChar *key2, const xmlChar *key3,
                      void *payload, xmlHashDeallocator dealloc, int update) {
    xmlChar *copy, *copy2, *copy3;
    xmlHashEntry *entry = NULL;
    size_t lengths[3] = {0, 0, 0};
    unsigned hashValue;
    int found = 0;

    if ((hash == NULL) || (key == NULL))
        return(-1);

    /*
     * Check for an existing entry
     */
    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, lengths);
    if (hash->size > 0)
        entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (found) {
        if (update) {
            if (dealloc)
                dealloc(entry->payload, entry->key);
            entry->payload = payload;
        }

        return(0);
    }

    /*
     * Grow the hash table if needed
     */
    if (hash->nbElems + 1 > hash->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (hash->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            /* This guarantees that nbElems < INT_MAX */
            if (hash->size >= MAX_HASH_SIZE)
                return(-1);
            newSize = hash->size * 2;
        }
        if (xmlHashGrow(hash, newSize) != 0)
            return(-1);

        /*
         * Find new entry
         */
        mask = hash->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &hash->table[pos];

        if (entry->hashValue != 0) {
            do {
                displ++;
                pos++;
                entry++;
                if ((pos & mask) == 0)
                    entry = hash->table;
            } while ((entry->hashValue != 0) &&
                     ((pos - entry->hashValue) & mask) >= displ);
        }
    }

    /*
     * Copy keys
     */
    if (hash->dict != NULL) {
        if (xmlDictOwns(hash->dict, key)) {
            copy = (xmlChar *) key;
        } else {
            copy = (xmlChar *) xmlDictLookup(hash->dict, key, -1);
            if (copy == NULL)
                return(-1);
        }

        if ((key2 == NULL) || (xmlDictOwns(hash->dict, key2))) {
            copy2 = (xmlChar *) key2;
        } else {
            copy2 = (xmlChar *) xmlDictLookup(hash->dict, key2, -1);
            if (copy2 == NULL)
                return(-1);
        }
        if ((key3 == NULL) || (xmlDictOwns(hash->dict, key3))) {
            copy3 = (xmlChar *) key3;
        } else {
            copy3 = (xmlChar *) xmlDictLookup(hash->dict, key3, -1);
            if (copy3 == NULL)
                return(-1);
        }
    } else {
        copy = xmlMalloc(lengths[0] + 1);
        if (copy == NULL)
            return(-1);
        memcpy(copy, key, lengths[0] + 1);

        if (key2 != NULL) {
            copy2 = xmlMalloc(lengths[1] + 1);
            if (copy2 == NULL) {
                xmlFree(copy);
                return(-1);
            }
            memcpy(copy2, key2, lengths[1] + 1);
        } else {
            copy2 = NULL;
        }

        if (key3 != NULL) {
            copy3 = xmlMalloc(lengths[2] + 1);
            if (copy3 == NULL) {
                xmlFree(copy);
                xmlFree(copy2);
                return(-1);
            }
            memcpy(copy3, key3, lengths[2] + 1);
        } else {
            copy3 = NULL;
        }
    }

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlHashEntry *end = &hash->table[hash->size];
        const xmlHashEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = hash->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&hash->table[1], hash->table,
                    (char *) cur - (char *) hash->table);
            cur = end - 1;
            hash->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->key = copy;
    entry->key2 = copy2;
    entry->key3 = copy3;
    entry->payload = payload;
    /* OR with MAX_HASH_SIZE to make sure that the value is non-zero */
    entry->hashValue = hashValue | MAX_HASH_SIZE;

    hash->nbElems++;

    return(1);
}